

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::ReadCord(CodedInputStream *this,Cord *output,int size)

{
  bool bVar1;
  int iVar2;
  Nonnull<const_char_*> pcVar3;
  int iVar4;
  string_view src;
  
  if (output == (Cord *)0x0) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       ((void *)0x0,(void *)0x0,"output != nullptr");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 != (Nonnull<const_char_*>)0x0) {
    ReadCord();
  }
  if (size < 0) {
    absl::lts_20250127::Cord::Clear(output);
  }
  else {
    if ((size < 0x200) || (this->input_ == (ZeroCopyInputStream *)0x0)) {
      iVar4 = *(int *)&this->buffer_end_ - (int)this->buffer_;
      iVar2 = size;
      if (iVar4 < size) {
        iVar2 = iVar4;
      }
      src._M_str = (char *)this->buffer_;
      src._M_len = (long)iVar2;
      absl::lts_20250127::Cord::operator=(output,src);
      this->buffer_ = this->buffer_ + iVar2;
      bVar1 = size <= iVar4;
      if (size <= iVar4) {
        return bVar1;
      }
      if (this->input_ == (ZeroCopyInputStream *)0x0) {
        return bVar1;
      }
      iVar4 = this->overflow_bytes_ + this->buffer_size_after_limit_;
      if (iVar4 != 0 && SCARRY4(this->overflow_bytes_,this->buffer_size_after_limit_) == iVar4 < 0)
      {
        return bVar1;
      }
      size = size - iVar2;
    }
    else {
      absl::lts_20250127::Cord::Clear(output);
      BackUpInputToCurrentPosition(this);
    }
    iVar2 = this->current_limit_;
    if (this->total_bytes_limit_ < this->current_limit_) {
      iVar2 = this->total_bytes_limit_;
    }
    if (size <= iVar2 - this->total_bytes_read_) {
      this->total_bytes_read_ = this->total_bytes_read_ + size;
      iVar2 = (*this->input_->_vptr_ZeroCopyInputStream[6])(this->input_,output,(ulong)(uint)size);
      return SUB41(iVar2,0);
    }
    this->total_bytes_read_ = iVar2;
    (*this->input_->_vptr_ZeroCopyInputStream[6])(this->input_,output);
  }
  return false;
}

Assistant:

bool CodedInputStream::ReadCord(absl::Cord* output, int size) {
  ABSL_DCHECK_NE(output, nullptr);

  // security: size is often user-supplied
  if (size < 0) {
    output->Clear();
    return false;  // security: size is often user-supplied
  }

  // Grab whatever is in the current output if `size` is relatively small,
  // or if we are not sourcing data from an input stream.
  if (input_ == nullptr || size < kMaxCordBytesToCopy) {
    // Just copy the current buffer into the output rather than backing up.
    absl::string_view buffer(reinterpret_cast<const char*>(buffer_),
                             static_cast<size_t>(std::min(size, BufferSize())));
    *output = buffer;
    Advance(static_cast<int>(buffer.size()));
    size -= static_cast<int>(buffer.size());
    if (size == 0) return true;
    if (input_ == nullptr || buffer_size_after_limit_ + overflow_bytes_ > 0) {
      // We hit a limit.
      return false;
    }
  } else {
    output->Clear();
    BackUpInputToCurrentPosition();
  }

  // Make sure to not cross a limit set by PushLimit() or SetTotalBytesLimit().
  const int closest_limit = std::min(current_limit_, total_bytes_limit_);
  const int available = closest_limit - total_bytes_read_;
  if (ABSL_PREDICT_FALSE(size > available)) {
    total_bytes_read_ = closest_limit;
    input_->ReadCord(output, available);
    return false;
  }
  total_bytes_read_ += size;
  return input_->ReadCord(output, size);
}